

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O1

void p_bracket(parse *p)

{
  byte bVar1;
  re_guts *prVar2;
  size_t sVar3;
  bool bVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  cset *pcVar8;
  uch *puVar9;
  ushort **ppuVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  cset *pcVar14;
  uch uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  cclass *pcVar20;
  size_t sVar21;
  sop op;
  char *pcVar22;
  char *pcVar23;
  uint uVar24;
  cset *cs;
  bool bVar25;
  
  prVar2 = p->g;
  uVar24 = prVar2->ncsets;
  prVar2->ncsets = uVar24 + 1;
  iVar7 = prVar2->csetsize;
  uVar16 = p->ncsalloc;
  if ((int)uVar16 <= (int)uVar24) {
    iVar19 = (int)((long)(int)uVar16 + 8);
    p->ncsalloc = iVar19;
    if ((uVar16 & 7) != 0) {
      __assert_fail("nc % CHAR_BIT == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                    ,0x47b,"cset *allocset()");
    }
    iVar19 = (iVar19 >> 3) * iVar7;
    sVar21 = ((long)(int)uVar16 + 8) * 0x20;
    if (prVar2->sets == (cset *)0x0) {
      pcVar8 = (cset *)malloc(sVar21);
      prVar2->sets = pcVar8;
    }
    else {
      pcVar8 = (cset *)realloc(prVar2->sets,sVar21);
      p->g->sets = pcVar8;
    }
    prVar2 = p->g;
    puVar9 = prVar2->setbits;
    if (puVar9 == (uch *)0x0) {
      puVar9 = (uch *)malloc((long)iVar19);
      prVar2->setbits = puVar9;
    }
    else {
      puVar9 = (uch *)realloc(puVar9,(long)iVar19);
      prVar2 = p->g;
      prVar2->setbits = puVar9;
      if (0 < (int)uVar24) {
        pcVar8 = prVar2->sets;
        uVar17 = 0;
        do {
          pcVar8->ptr = puVar9 + (uVar17 >> 3 & 0x1fffffff) * (long)iVar7;
          uVar17 = uVar17 + 1;
          pcVar8 = pcVar8 + 1;
        } while (uVar24 != uVar17);
      }
    }
    if ((p->g->sets == (cset *)0x0) || (puVar9 = p->g->setbits, puVar9 == (uch *)0x0)) {
      if (p->error == 0) {
        p->error = 0xc;
      }
      p->next = nuls;
      p->end = nuls;
      uVar24 = 0;
    }
    else {
      memset(puVar9 + (iVar19 - iVar7),0,(long)iVar7);
    }
  }
  pcVar8 = p->g->sets;
  if (pcVar8 == (cset *)0x0) {
    __assert_fail("p->g->sets != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                  ,0x495,"cset *allocset()");
  }
  uVar16 = uVar24 + 7;
  if (-1 < (int)uVar24) {
    uVar16 = uVar24;
  }
  pcVar8[(int)uVar24].ptr = p->g->setbits + ((int)uVar16 >> 3) * iVar7;
  pcVar8[(int)uVar24].mask = (uch)(1 << ((byte)uVar24 & 7));
  pcVar8[(int)uVar24].hash = '\0';
  pcVar8[(int)uVar24].smultis = 0;
  (&pcVar8[(int)uVar24].smultis)[1] = 0;
  pcVar12 = p->next;
  pcVar23 = p->end;
  if (pcVar12 + 5 < pcVar23) {
    iVar7 = strncmp(pcVar12,"[:<:]]",6);
    if (iVar7 == 0) {
      op = 0x4c000000;
LAB_00105311:
      doemit(p,op,0);
      p->next = p->next + 6;
      return;
    }
    if ((pcVar12 + 5 < pcVar23) && (iVar7 = strncmp(pcVar12,"[:>:]]",6), iVar7 == 0)) {
      op = 0x50000000;
      goto LAB_00105311;
    }
  }
  bVar4 = true;
  if ((pcVar12 < pcVar23) && (*pcVar12 == '^')) {
    p->next = pcVar12 + 1;
    bVar4 = false;
  }
  cs = pcVar8 + (int)uVar24;
  pcVar12 = p->next;
  if (pcVar12 < pcVar23) {
    if (*pcVar12 == ']') {
      cVar5 = ']';
      lVar18 = 0x5d;
    }
    else {
      if ((pcVar23 <= pcVar12) || (*pcVar12 != '-')) goto LAB_00104c3c;
      cVar5 = '-';
      lVar18 = 0x2d;
    }
    p->next = pcVar12 + 1;
    cs->ptr[lVar18] = cs->ptr[lVar18] | cs->mask;
    cs->hash = cs->hash + cVar5;
  }
LAB_00104c3c:
  pcVar12 = p->next;
  pcVar23 = p->end;
  bVar25 = pcVar12 < pcVar23;
  if (bVar25) {
    cVar5 = *pcVar12;
    if (cVar5 != ']') {
LAB_00104ec8:
      pcVar22 = pcVar12 + 1;
      if ((cVar5 != '-' || pcVar23 <= pcVar22) || (*pcVar22 != ']')) {
        if (cVar5 == '-') {
          if (p->error == 0) {
            p->error = 0xb;
          }
          goto LAB_00105180;
        }
        cVar6 = '\0';
        if ((cVar5 == '[') && (cVar6 = '\0', pcVar22 < pcVar23)) {
          cVar6 = *pcVar22;
        }
        if (cVar6 == '=') {
          p->next = pcVar12 + 2;
          if (pcVar23 <= pcVar12 + 2) {
            if (p->error == 0) {
              p->error = 7;
            }
            p->next = nuls;
            p->end = nuls;
          }
          if ((*p->next == ']') || (*p->next == '-')) {
            if (p->error == 0) {
              p->error = 3;
            }
            p->next = nuls;
            p->end = nuls;
          }
          cVar5 = p_b_coll_elem(p,0x3d);
          cs->ptr[cVar5] = cs->ptr[cVar5] | cs->mask;
          cs->hash = cs->hash + cVar5;
          if (p->end <= p->next) {
            if (p->error == 0) {
              p->error = 7;
            }
            p->next = nuls;
            p->end = nuls;
          }
          pcVar12 = p->next;
          if ((((p->end <= pcVar12) || (p->end <= pcVar12 + 1)) || (*pcVar12 != '=')) ||
             (pcVar12[1] != ']')) {
            if (p->error == 0) {
              p->error = 3;
            }
            goto LAB_00105180;
          }
          goto LAB_00105122;
        }
        if (cVar6 == ':') {
          p->next = pcVar12 + 2;
          if (pcVar23 <= pcVar12 + 2) {
            if (p->error == 0) {
              p->error = 7;
            }
            p->next = nuls;
            p->end = nuls;
          }
          if ((*p->next == ']') || (*p->next == '-')) {
            if (p->error == 0) {
              p->error = 4;
            }
            p->next = nuls;
            p->end = nuls;
          }
          pcVar12 = p->next;
          pcVar23 = p->end;
          pcVar22 = pcVar12;
          if (pcVar12 < pcVar23) {
            ppuVar10 = __ctype_b_loc();
            do {
              if ((*(byte *)((long)*ppuVar10 + (long)*pcVar22 * 2 + 1) & 4) == 0) break;
              pcVar22 = pcVar22 + 1;
              p->next = pcVar22;
            } while (pcVar22 != pcVar23);
          }
          bVar25 = false;
          pcVar20 = cclasses;
          pcVar23 = "alnum";
LAB_00104faa:
          pcVar20 = pcVar20 + 1;
          iVar7 = strncmp(pcVar23,pcVar12,(long)pcVar22 - (long)pcVar12);
          if ((iVar7 != 0) || (pcVar23[(long)pcVar22 - (long)pcVar12] != '\0')) goto LAB_00104fc8;
          if (!bVar25) {
            pcVar12 = pcVar20[-1].chars;
            cVar5 = *pcVar12;
            while (cVar5 != '\0') {
              pcVar12 = pcVar12 + 1;
              cs->ptr[cVar5] = cs->ptr[cVar5] | cs->mask;
              cs->hash = cs->hash + cVar5;
              cVar5 = *pcVar12;
            }
            pcVar12 = pcVar20[-1].multis;
            cVar5 = *pcVar12;
            while (cVar5 != '\0') {
              sVar3 = cs->smultis;
              sVar21 = strlen(pcVar12);
              sVar21 = sVar21 + sVar3 + 1;
              cs->smultis = sVar21;
              if (cs->multis == (char *)0x0) {
                pcVar23 = (char *)malloc(sVar21);
              }
              else {
                pcVar23 = (char *)realloc(cs->multis,sVar21);
              }
              cs->multis = pcVar23;
              if (pcVar23 == (char *)0x0) {
                if (p->error == 0) {
                  p->error = 0xc;
                }
                p->next = nuls;
                p->end = nuls;
              }
              else {
                strcpy(pcVar23 + (sVar3 - 1),pcVar12);
                pcVar23[pcVar8[(int)uVar24].smultis - 1] = '\0';
              }
              sVar21 = strlen(pcVar12);
              pcVar12 = pcVar12 + sVar21 + 1;
              cVar5 = *pcVar12;
            }
            goto LAB_00104ffa;
          }
          goto LAB_00104fd8;
        }
        cVar6 = p_b_symbol(p);
        pcVar12 = p->next;
        cVar5 = cVar6;
        if (((pcVar12 < p->end) && (*pcVar12 == '-')) &&
           ((pcVar23 = pcVar12 + 1, pcVar23 < p->end && (*pcVar23 != ']')))) {
          p->next = pcVar23;
          if (*pcVar23 == '-') {
            p->next = pcVar12 + 2;
            cVar5 = '-';
          }
          else {
            cVar5 = p_b_symbol(p);
          }
        }
        if (cVar5 < cVar6) {
          if (p->error == 0) {
            p->error = 0xb;
          }
          p->next = nuls;
          p->end = nuls;
          if (cVar6 <= cVar5) goto LAB_001051d1;
        }
        else {
LAB_001051d1:
          lVar18 = (long)cVar6;
          do {
            cs->ptr[lVar18] = cs->ptr[lVar18] | cs->mask;
            cs->hash = cs->hash + (char)lVar18;
            lVar18 = lVar18 + 1;
          } while ((long)cVar5 + 1 != lVar18);
        }
        goto LAB_00105188;
      }
    }
LAB_00104c5b:
    if ((bVar25) && (*pcVar12 == '-')) {
      p->next = pcVar12 + 1;
      cs->ptr[0x2d] = cs->ptr[0x2d] | cs->mask;
      cs->hash = cs->hash + '-';
    }
  }
LAB_00104c7b:
  pcVar12 = p->next;
  if ((p->end <= pcVar12) || (p->next = pcVar12 + 1, *pcVar12 != ']')) {
    if (p->error == 0) {
      p->error = 7;
    }
    p->next = nuls;
    p->end = nuls;
  }
  if (p->error != 0) {
    return;
  }
  if ((p->g->cflags & 2) != 0) {
    uVar17 = (ulong)p->g->csetsize;
    if (0 < (long)uVar17) {
      do {
        uVar11 = uVar17 - 1;
        if (((cs->ptr[uVar11 & 0xff] & cs->mask) != 0) &&
           (ppuVar10 = __ctype_b_loc(), (*(byte *)((long)*ppuVar10 + uVar17 * 2 + -1) & 4) != 0)) {
          cVar5 = othercase((int)uVar17 + -1);
          if (uVar11 != (uint)(int)cVar5) {
            cs->ptr[cVar5] = cs->ptr[cVar5] | cs->mask;
            cs->hash = cs->hash + cVar5;
          }
        }
        bVar25 = 1 < (long)uVar17;
        uVar17 = uVar11;
      } while (bVar25);
    }
    if (cs->multis != (char *)0x0) {
      __assert_fail("cs->multis == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                    ,0x282,"void p_bracket()");
    }
  }
  if (!bVar4) {
    uVar11 = (ulong)p->g->csetsize;
    uVar17 = uVar11;
    if (0 < (long)uVar11) {
      do {
        uVar13 = uVar17 - 1;
        uVar11 = uVar11 - 1;
        puVar9 = cs->ptr;
        bVar1 = cs->mask;
        if ((puVar9[uVar13 & 0xff] & bVar1) == 0) {
          puVar9[uVar13] = puVar9[uVar13] | bVar1;
          uVar15 = cs->hash + (char)uVar13;
        }
        else {
          puVar9[uVar13] = puVar9[uVar13] & ~bVar1;
          uVar15 = cs->hash - (char)uVar11;
        }
        cs->hash = uVar15;
        bVar4 = 1 < (long)uVar17;
        uVar17 = uVar13;
      } while (bVar4);
    }
    if ((p->g->cflags & 8) != 0) {
      cs->ptr[10] = cs->ptr[10] & ~cs->mask;
      cs->hash = cs->hash + 0xf6;
    }
    if (cs->multis != (char *)0x0) {
      __assert_fail("cs->multis == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                    ,0x292,"void p_bracket()");
    }
  }
  if (cs->multis != (char *)0x0) {
    __assert_fail("cs->multis == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                  ,0x299,"void p_bracket()");
  }
  prVar2 = p->g;
  iVar7 = prVar2->csetsize;
  uVar17 = (ulong)iVar7;
  if (uVar17 != 0) {
    iVar19 = 0;
    uVar11 = 0;
    do {
      iVar19 = (iVar19 + 1) - (uint)((cs->ptr[uVar11 & 0xff] & cs->mask) == 0);
      uVar11 = uVar11 + 1;
    } while (uVar17 != uVar11);
    if (iVar19 == 1) {
      if (iVar7 != 0) {
        iVar7 = 0;
        uVar11 = 0;
        do {
          if ((cs->ptr[uVar11 & 0xff] & cs->mask) != 0) {
            ordinary(p,iVar7 >> 0x18);
            freeset(p,cs);
            return;
          }
          uVar11 = uVar11 + 1;
          iVar7 = iVar7 + 0x1000000;
        } while (uVar17 != uVar11);
      }
      __assert_fail("never",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                    ,0x4e7,"int firstch()");
    }
  }
  if (0 < (long)prVar2->ncsets) {
    pcVar8 = prVar2->sets;
    pcVar14 = pcVar8 + prVar2->ncsets;
    do {
      if ((pcVar8 != cs) && (pcVar8->hash == cs->hash)) {
        if (iVar7 == 0) {
          uVar11 = 0;
        }
        else {
          uVar13 = 0;
          do {
            uVar11 = uVar13;
            if (((pcVar8->ptr[uVar13 & 0xff] & pcVar8->mask) != 0) ==
                ((cs->ptr[uVar13 & 0xff] & cs->mask) == 0)) break;
            uVar13 = uVar13 + 1;
            uVar11 = uVar17;
          } while (uVar17 != uVar13);
        }
        if (uVar11 == uVar17) {
          freeset(p,cs);
          cs = pcVar8;
          break;
        }
      }
      pcVar8 = pcVar8 + 1;
    } while (pcVar8 < pcVar14);
  }
  doemit(p,0x18000000,(long)(int)((ulong)((long)cs - (long)p->g->sets) >> 5));
  return;
LAB_00104fc8:
  pcVar23 = pcVar20->name;
  bVar25 = pcVar23 == (char *)0x0;
  if (bVar25) goto LAB_00104fd8;
  goto LAB_00104faa;
LAB_00104fd8:
  if (p->error == 0) {
    p->error = 4;
  }
  p->next = nuls;
  p->end = nuls;
LAB_00104ffa:
  if (p->end <= p->next) {
    if (p->error == 0) {
      p->error = 7;
    }
    p->next = nuls;
    p->end = nuls;
  }
  pcVar12 = p->next;
  if ((((pcVar12 < p->end) && (pcVar12 + 1 < p->end)) && (*pcVar12 == ':')) && (pcVar12[1] == ']'))
  {
LAB_00105122:
    p->next = pcVar12 + 2;
  }
  else {
    if (p->error == 0) {
      p->error = 4;
    }
LAB_00105180:
    p->next = nuls;
    p->end = nuls;
  }
LAB_00105188:
  pcVar12 = p->next;
  pcVar23 = p->end;
  bVar25 = pcVar12 < pcVar23;
  if (!bVar25) goto LAB_00104c7b;
  cVar5 = *pcVar12;
  if (cVar5 == ']') goto LAB_00104c5b;
  goto LAB_00104ec8;
}

Assistant:

static void
p_bracket(p)
struct parse *p;
{
	cset *cs = allocset(p);
	int invert = 0;

	/* Dept of Truly Sickening Special-Case Kludges */
	if (p->next + 5 < p->end && strncmp(p->next, "[:<:]]", 6) == 0) {
		EMIT(OBOW, 0);
		NEXTn(6);
		return;
	}
	if (p->next + 5 < p->end && strncmp(p->next, "[:>:]]", 6) == 0) {
		EMIT(OEOW, 0);
		NEXTn(6);
		return;
	}

	if (EAT('^'))
		invert++;	/* make note to invert set at end */
	if (EAT(']'))
		CHadd(cs, ']');
	else if (EAT('-'))
		CHadd(cs, '-');
	while (MORE() && PEEK() != ']' && !SEETWO('-', ']'))
		p_b_term(p, cs);
	if (EAT('-'))
		CHadd(cs, '-');
	MUSTEAT(']', REG_EBRACK);

	if (p->error != 0)	/* don't mess things up further */
		return;

	if (p->g->cflags&REG_ICASE) {
		int i;
		int ci;

		for (i = p->g->csetsize - 1; i >= 0; i--)
			if (CHIN(cs, i) && isalpha(i)) {
				ci = othercase(i);
				if (ci != i)
					CHadd(cs, ci);
			}
		assert(cs->multis == NULL);	/* xxx */
#if 0		
		if (cs->multis != NULL)
			mccase(p, cs);
#endif
	}
	if (invert) {
		int i;

		for (i = p->g->csetsize - 1; i >= 0; i--)
			if (CHIN(cs, i))
				CHsub(cs, i);
			else
				CHadd(cs, i);
		if (p->g->cflags&REG_NEWLINE)
			CHsub(cs, '\n');
		assert(cs->multis == NULL);	/* xxx */
#if 0
		if (cs->multis != NULL)
			mcinvert(p, cs);
#endif
	}

	assert(cs->multis == NULL);		/* xxx */

	if (nch(p, cs) == 1) {		/* optimize singleton sets */
		ordinary(p, firstch(p, cs));
		freeset(p, cs);
	} else
		EMIT(OANYOF, freezeset(p, cs));
}